

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O3

void __thiscall QStringListModel::sort(QStringListModel *this,int param_1,SortOrder order)

{
  QStringListModel *this_00;
  int iVar1;
  iterator __first;
  iterator __last;
  ulong uVar2;
  pointer piVar3;
  uint uVar4;
  code *__comp;
  long lVar5;
  long in_FS_OFFSET;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Data *local_d8;
  QPersistentModelIndex *pQStack_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  QList<QModelIndex> local_b8;
  QModelIndexList local_98;
  QList<int> local_78;
  QArrayDataPointer<std::pair<QString,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QString,_int> *)0x0;
  local_58.size = 0;
  QAbstractItemModel::layoutAboutToBeChanged
            ((QAbstractItemModel *)this,(QList<QPersistentModelIndex> *)&local_58,VerticalSortHint);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_58);
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QString,_int> *)0x0;
  local_58.size = 0;
  uVar4 = (uint)*(undefined8 *)(this + 0x20);
  QList<std::pair<QString,_int>_>::reserve
            ((QList<std::pair<QString,_int>_> *)&local_58,(long)(int)uVar4);
  local_78.d.d._0_4_ = 0;
  iVar1 = (int)local_78.d.d;
  local_78.d.d._0_4_ = 0;
  if (0 < (int)uVar4) {
    do {
      QtPrivate::QMovableArrayOps<std::pair<QString,int>>::emplace<QString_const&,int&>
                ((QMovableArrayOps<std::pair<QString,int>> *)&local_58,local_58.size,
                 (QString *)((long)(int)local_78.d.d * 0x18 + *(long *)(this + 0x18)),
                 (int *)&local_78);
      QList<std::pair<QString,_int>_>::end((QList<std::pair<QString,_int>_> *)&local_58);
      local_78.d.d._0_4_ = (int)local_78.d.d + 1;
      iVar1 = (int)local_78.d.d;
    } while ((int)local_78.d.d < (int)uVar4);
  }
  local_78.d.d._0_4_ = iVar1;
  if (order == AscendingOrder) {
    __first = QList<std::pair<QString,_int>_>::begin((QList<std::pair<QString,_int>_> *)&local_58);
    __last = QList<std::pair<QString,_int>_>::end((QList<std::pair<QString,_int>_> *)&local_58);
    if (__first.i == __last.i) goto LAB_00490363;
    uVar2 = (long)__last.i - (long)__first.i >> 5;
    lVar5 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    __comp = ascendingLessThan;
    std::
    __introsort_loop<QList<std::pair<QString,int>>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QString,int>const&,std::pair<QString,int>const&)>>
              (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_std::pair<QString,_int>_&,_const_std::pair<QString,_int>_&)>
                )0x490689);
  }
  else {
    __first = QList<std::pair<QString,_int>_>::begin((QList<std::pair<QString,_int>_> *)&local_58);
    __last = QList<std::pair<QString,_int>_>::end((QList<std::pair<QString,_int>_> *)&local_58);
    if (__first.i == __last.i) goto LAB_00490363;
    uVar2 = (long)__last.i - (long)__first.i >> 5;
    lVar5 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    __comp = decendingLessThan;
    std::
    __introsort_loop<QList<std::pair<QString,int>>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QString,int>const&,std::pair<QString,int>const&)>>
              (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_std::pair<QString,_int>_&,_const_std::pair<QString,_int>_&)>
                )0x4906b1);
  }
  std::
  __final_insertion_sort<QList<std::pair<QString,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QString,int>const&,std::pair<QString,int>const&)>>
            (__first,__last,
             (_Iter_comp_iter<bool_(*)(const_std::pair<QString,_int>_&,_const_std::pair<QString,_int>_&)>
              )__comp);
LAB_00490363:
  this_00 = this + 0x10;
  QList<QString>::clear((QList<QString> *)this_00);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList(&local_78,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    lVar5 = 0;
    uVar2 = 0;
    do {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)this_00,*(qsizetype *)(this + 0x20),
                 (QString *)((long)&((local_58.ptr)->first).d.d + lVar5));
      QList<QString>::end((QList<QString> *)this_00);
      iVar1 = *(int *)((long)&(local_58.ptr)->second + lVar5);
      piVar3 = QList<int>::data(&local_78);
      piVar3[iVar1] = (int)uVar2;
      uVar2 = uVar2 + 1;
      lVar5 = lVar5 + 0x20;
    } while ((uVar4 & 0x7fffffff) != uVar2);
  }
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemModel::persistentIndexList(&local_98,(QAbstractItemModel *)this);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (QModelIndex *)0x0;
  local_b8.d.size = 0;
  uVar4 = (uint)local_98.d.size;
  QList<QModelIndex>::reserve(&local_b8,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    uVar2 = (ulong)(uVar4 & 0x7fffffff);
    lVar5 = 0;
    do {
      local_f0 = 0xffffffffffffffff;
      local_e8 = 0;
      uStack_e0 = 0;
      (**(code **)(*(long *)this + 0x60))
                ((QModelIndex *)&local_d8,this,
                 local_78.d.ptr[*(int *)((long)&(local_98.d.ptr)->r + lVar5)],0,&local_f0);
      QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                ((QMovableArrayOps<QModelIndex> *)&local_b8,local_b8.d.size,(QModelIndex *)&local_d8
                );
      QList<QModelIndex>::end(&local_b8);
      lVar5 = lVar5 + 0x18;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  QAbstractItemModel::changePersistentIndexList((QAbstractItemModel *)this,&local_98,&local_b8);
  local_d8 = (Data *)0x0;
  pQStack_d0 = (QPersistentModelIndex *)0x0;
  local_c8.ptr = (QAbstractItemModel *)0x0;
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this,(QList<QPersistentModelIndex> *)&local_d8,VerticalSortHint);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_d8);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
    }
  }
  QArrayDataPointer<std::pair<QString,_int>_>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStringListModel::sort(int, Qt::SortOrder order)
{
    emit layoutAboutToBeChanged(QList<QPersistentModelIndex>(), VerticalSortHint);

    QList<std::pair<QString, int>> list;
    const int lstCount = lst.size();
    list.reserve(lstCount);
    for (int i = 0; i < lstCount; ++i)
        list.emplace_back(lst.at(i), i);

    if (order == Qt::AscendingOrder)
        std::sort(list.begin(), list.end(), ascendingLessThan);
    else
        std::sort(list.begin(), list.end(), decendingLessThan);

    lst.clear();
    QList<int> forwarding(lstCount);
    for (int i = 0; i < lstCount; ++i) {
        lst.append(list.at(i).first);
        forwarding[list.at(i).second] = i;
    }

    QModelIndexList oldList = persistentIndexList();
    QModelIndexList newList;
    const int numOldIndexes = oldList.size();
    newList.reserve(numOldIndexes);
    for (int i = 0; i < numOldIndexes; ++i)
        newList.append(index(forwarding.at(oldList.at(i).row()), 0));
    changePersistentIndexList(oldList, newList);

    emit layoutChanged(QList<QPersistentModelIndex>(), VerticalSortHint);
}